

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringLowering.cpp
# Opt level: O0

void __thiscall wasm::StringLowering::makeImports(StringLowering *this,Module *module)

{
  bool bVar1;
  char *__s;
  bool bVar2;
  vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
  *this_00;
  pointer pGVar3;
  Fatal *pFVar4;
  ulong uVar5;
  vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_> *this_01;
  string *defaultValue;
  string_view str_00;
  string_view str_01;
  allocator<char> local_8b1;
  CustomSection local_8b0;
  allocator_type local_871;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_870;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_868;
  undefined1 local_860 [8];
  vector<char,_std::allocator<char>_> vec;
  undefined1 local_828 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  __string_type jsonString;
  string local_7d0;
  Name local_7b0;
  Name local_7a0;
  char local_789;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_788;
  Fatal local_768;
  string local_5e0 [32];
  undefined1 local_5c0 [16];
  stringstream local_5b0 [8];
  stringstream escaped;
  String local_5a0 [376];
  string local_428;
  Name local_408;
  size_t local_3f8;
  char *pcStack_3f0;
  stringstream local_3e8 [8];
  stringstream utf8;
  ostream local_3d8 [376];
  StringConst *local_260;
  StringConst *c;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *global;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
  *__range2;
  stringstream local_230 [7];
  bool first;
  stringstream json;
  ostream local_220 [376];
  uint local_a8;
  allocator<char> local_a1;
  Index jsonImportIndex;
  allocator<char> local_69;
  string local_68;
  string local_48;
  undefined1 local_28 [8];
  Name stringConstsModule;
  Module *module_local;
  StringLowering *this_local;
  
  stringConstsModule.super_IString.str._M_str = (char *)module;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"string-constants-module",&local_69);
  __s = WasmStringConstsModule;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&jsonImportIndex,__s,&local_a1);
  defaultValue = (string *)&jsonImportIndex;
  Pass::getArgumentOrDefault(&local_48,(Pass *)this,&local_68,defaultValue);
  wasm::Name::Name((Name *)local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&jsonImportIndex);
  std::allocator<char>::~allocator(&local_a1);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  local_a8 = 0;
  std::__cxx11::stringstream::stringstream(local_230);
  bVar1 = true;
  this_00 = (vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             *)(stringConstsModule.super_IString.str._M_str + 0x30);
  __end2 = std::
           vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ::begin(this_00);
  global = (unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)
           std::
           vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ::end(this_00);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_*,_std::vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>_>
                                *)&global);
    if (!bVar2) {
      std::__cxx11::stringstream::str();
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        if (((this->assertUTF8 ^ 0xffU) & 1) == 0) {
          __assert_fail("!assertUTF8",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/StringLowering.cpp"
                        ,0x117,"void wasm::StringLowering::makeImports(Module *)");
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &vec.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,'[',
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&str.field_2 + 8));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_828,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &vec.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,']');
        std::__cxx11::string::~string
                  ((string *)&vec.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10
                  );
        local_868._M_current = (char *)std::__cxx11::string::begin();
        local_870._M_current = (char *)std::__cxx11::string::end();
        std::allocator<char>::allocator();
        std::vector<char,std::allocator<char>>::
        vector<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                  ((vector<char,std::allocator<char>> *)local_860,local_868,local_870,&local_871);
        std::allocator<char>::~allocator(&local_871);
        this_01 = (vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_> *)
                  (stringConstsModule.super_IString.str._M_str + 0xd0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_8b0,"string.consts",&local_8b1);
        std::vector<char,_std::allocator<char>_>::vector
                  (&local_8b0.data,(vector<char,_std::allocator<char>_> *)local_860);
        std::vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>::
        emplace_back<wasm::CustomSection>(this_01,&local_8b0);
        CustomSection::~CustomSection(&local_8b0);
        std::allocator<char>::~allocator(&local_8b1);
        std::vector<char,_std::allocator<char>_>::~vector
                  ((vector<char,_std::allocator<char>_> *)local_860);
        std::__cxx11::string::~string((string *)local_828);
      }
      std::__cxx11::string::~string((string *)(str.field_2._M_local_buf + 8));
      std::__cxx11::stringstream::~stringstream(local_230);
      return;
    }
    c = (StringConst *)
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_*,_std::vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>_>
        ::operator*(&__end2);
    pGVar3 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                       ((unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)c);
    if (pGVar3->init != (Expression *)0x0) {
      pGVar3 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                         ((unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)c);
      local_260 = Expression::dynCast<wasm::StringConst>(pGVar3->init);
      if (local_260 != (StringConst *)0x0) {
        std::__cxx11::stringstream::stringstream(local_3e8);
        if ((this->useMagicImports & 1U) == 0) {
LAB_0209fea2:
          if ((this->assertUTF8 & 1U) != 0) {
            std::__cxx11::stringstream::stringstream(local_5b0);
            std::__cxx11::stringstream::str();
            local_5c0 = std::__cxx11::string::operator_cast_to_basic_string_view(local_5e0);
            str_00._M_len = local_5c0._8_8_;
            str_00._M_str = (char *)defaultValue;
            String::printEscaped(local_5a0,local_5c0._0_8_,str_00);
            std::__cxx11::string::~string(local_5e0);
            Fatal::Fatal(&local_768);
            pFVar4 = Fatal::operator<<(&local_768,(char (*) [32])"Cannot lower non-UTF-16 string ");
            std::__cxx11::stringstream::str();
            pFVar4 = Fatal::operator<<(pFVar4,&local_788);
            local_789 = '\n';
            Fatal::operator<<(pFVar4,&local_789);
            std::__cxx11::string::~string((string *)&local_788);
            Fatal::~Fatal(&local_768);
          }
          wasm::Name::Name(&local_7a0,"string.const");
          pGVar3 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                             ((unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)c);
          wasm::Name::operator=(&(pGVar3->super_Importable).module,&local_7a0);
          std::__cxx11::to_string(&local_7d0,local_a8);
          wasm::Name::Name(&local_7b0,&local_7d0);
          pGVar3 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                             ((unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)c);
          wasm::Name::operator=(&(pGVar3->super_Importable).base,&local_7b0);
          std::__cxx11::string::~string((string *)&local_7d0);
          if (bVar1) {
            bVar1 = false;
          }
          else {
            std::operator<<(local_220,',');
          }
          str_01._M_str = (char *)defaultValue;
          str_01._M_len = (size_t)(local_260->string).super_IString.str._M_str;
          String::printEscapedJSON
                    ((String *)local_220,(ostream *)(local_260->string).super_IString.str._M_len,
                     str_01);
          local_a8 = local_a8 + 1;
        }
        else {
          local_3f8 = (local_260->string).super_IString.str._M_len;
          pcStack_3f0 = (local_260->string).super_IString.str._M_str;
          bVar2 = String::convertUTF16ToUTF8(local_3d8,(local_260->string).super_IString.str);
          if (!bVar2) goto LAB_0209fea2;
          pGVar3 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                             ((unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)c);
          wasm::Name::operator=(&(pGVar3->super_Importable).module,(Name *)local_28);
          std::__cxx11::stringstream::str();
          wasm::Name::Name(&local_408,&local_428);
          pGVar3 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                             ((unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)c);
          wasm::Name::operator=(&(pGVar3->super_Importable).base,&local_408);
          std::__cxx11::string::~string((string *)&local_428);
        }
        pGVar3 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                           ((unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)c);
        pGVar3->init = (Expression *)0x0;
        std::__cxx11::stringstream::~stringstream(local_3e8);
      }
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_*,_std::vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

void makeImports(Module* module) {
    Name stringConstsModule =
      getArgumentOrDefault("string-constants-module", WasmStringConstsModule);
    Index jsonImportIndex = 0;
    std::stringstream json;
    bool first = true;
    for (auto& global : module->globals) {
      if (global->init) {
        if (auto* c = global->init->dynCast<StringConst>()) {
          std::stringstream utf8;
          if (useMagicImports &&
              String::convertUTF16ToUTF8(utf8, c->string.str)) {
            global->module = stringConstsModule;
            global->base = Name(utf8.str());
          } else {
            if (assertUTF8) {
              std::stringstream escaped;
              String::printEscaped(escaped, utf8.str());
              Fatal() << "Cannot lower non-UTF-16 string " << escaped.str()
                      << '\n';
            }
            global->module = "string.const";
            global->base = std::to_string(jsonImportIndex);
            if (first) {
              first = false;
            } else {
              json << ',';
            }
            String::printEscapedJSON(json, c->string.str);
            jsonImportIndex++;
          }
          global->init = nullptr;
        }
      }
    }

    auto jsonString = json.str();
    if (!jsonString.empty()) {
      // If we are asserting UTF8, then we shouldn't be generating any JSON.
      assert(!assertUTF8);
      // Add a custom section with the JSON.
      auto str = '[' + jsonString + ']';
      auto vec = std::vector<char>(str.begin(), str.end());
      module->customSections.emplace_back(
        CustomSection{"string.consts", std::move(vec)});
    }
  }